

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

int iniparser_getboolean(dictionary *d,char *key,int notfound)

{
  __int32_t *p_Var1;
  char *__s;
  __int32_t **pp_Var2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  __s = iniparser_getstring(d,key,(char *)0xffffffffffffffff);
  iVar5 = notfound;
  if ((char *)0x1 < __s + 1) {
    pp_Var2 = __ctype_tolower_loc();
    p_Var1 = *pp_Var2;
    iVar4 = p_Var1[*__s] << 0x18;
    iVar5 = 1;
    if ((((iVar4 != 0x31000000) && (iVar4 != 0x74000000)) && (iVar4 != 0x79000000)) &&
       ((iVar5 = 0, iVar4 != 0x30000000 && (p_Var1[*__s] & 0xf7U) != 0x66 &&
        (iVar5 = notfound, iVar4 == 0x6f000000)))) {
      iVar4 = p_Var1[__s[1]];
      iVar5 = 1;
      if (((iVar4 != 0x6e) &&
          ((sVar3 = strlen(__s), iVar5 = notfound, iVar4 == 0x66 && (2 < sVar3)))) &&
         (p_Var1[__s[2]] == 0x66)) {
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int iniparser_getboolean(const dictionary * d, const char * key, int notfound)
{
    int          ret = notfound;
    const char * c ;
    char         ch;

    c = iniparser_getstring(d, key, INI_INVALID_KEY);
    if (c==NULL || c==INI_INVALID_KEY) return notfound ;
    ch = tolower(c[0]);
    if (ch=='y' || ch=='t' || ch=='1') {
        ret = 1 ;
    } else if (ch=='n' || ch=='f' || ch=='0') {
        ret = 0 ;
    } else {
        /* allow 'on' and 'off' */
        if (ch=='o') {
            /* strings are null-terminated so c[1] exists at this point */
            if (tolower(c[1])=='n') {
                ret = 1;
            } else if (strlen(c)>2) {
                if (tolower(c[1])=='f' && tolower(c[2])=='f') {
                  ret =0;
               }
            }
        }
    }
    return ret;
}